

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
* ColorTracker::getContours
            (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *__return_storage_ptr__,Mat *mask)

{
  int iVar1;
  ProcessingException *this;
  Point_<int> local_1b0;
  _OutputArray local_1a8;
  _InputArray local_190;
  undefined1 local_173;
  undefined1 local_172;
  allocator local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Mat *local_18;
  Mat *mask_local;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *contours;
  
  local_18 = mask;
  mask_local = (Mat *)__return_storage_ptr__;
  iVar1 = cv::Mat::channels(mask);
  if (iVar1 == 1) {
    local_173 = 0;
    std::
    vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    ::vector(__return_storage_ptr__);
    cv::_InputArray::_InputArray(&local_190,local_18);
    cv::_OutputArray::_OutputArray<cv::Point_<int>>(&local_1a8,__return_storage_ptr__);
    cv::Point_<int>::Point_(&local_1b0);
    cv::findContours(&local_190,&local_1a8,0,3,&local_1b0);
    cv::_OutputArray::~_OutputArray(&local_1a8);
    cv::_InputArray::~_InputArray(&local_190);
    return __return_storage_ptr__;
  }
  local_172 = 1;
  this = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_119);
  std::operator+(&local_f8,"in ",&local_118);
  std::operator+(&local_d8,&local_f8,", at Line ");
  std::__cxx11::to_string(&local_150,0xf2);
  std::operator+(&local_b8,&local_d8,&local_150);
  std::operator+(&local_98,&local_b8,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"getContours",&local_171);
  std::operator+(&local_78,&local_98,&local_170);
  std::operator+(&local_58,&local_78,"(): ");
  std::operator+(&local_38,&local_58,"invalid input: passed image must have 1 channel");
  ProcessingException::ProcessingException(this,&local_38);
  local_172 = 0;
  __cxa_throw(this,&ProcessingException::typeinfo,ProcessingException::~ProcessingException);
}

Assistant:

vector<vector<Point>> ColorTracker::getContours(const Mat& mask) noexcept(false){
    if(mask.channels()!=1){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 1 channel");
    }
    vector<vector<Point>> contours;

    cv::findContours(mask,contours,cv::RETR_EXTERNAL,cv::CHAIN_APPROX_TC89_L1);

    return contours;
}